

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void C_ReadCVars(BYTE **demo_p)

{
  FBaseCVar *this;
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  BYTE *pBVar4;
  size_t sVar5;
  char *__s;
  BYTE *__s_00;
  UCVarValue value;
  TArray<FBaseCVar_*,_FBaseCVar_*> cvars;
  
  pBVar4 = *demo_p;
  if (*pBVar4 == '\\') {
    if (pBVar4[1] == '\\') {
      cvars.Array = (FBaseCVar **)0x0;
      cvars.Most = 0;
      cvars.Count = 0;
      pcVar2 = strchr((char *)(pBVar4 + 2),0x5c);
      *pcVar2 = '\0';
      uVar3 = strtoul((char *)(pBVar4 + 2),(char **)0x0,0x10);
      *pcVar2 = '\\';
      FilterCompactCVars(&cvars,(DWORD)uVar3);
      while (cvars.Count != 0) {
        value.String = pcVar2 + 1;
        uVar1 = cvars.Count - 1;
        cvars.Count = uVar1;
        this = cvars.Array[uVar1];
        pcVar2 = strchr(value.String,0x5c);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        FBaseCVar::ForceSet(this,value,CVAR_String,false);
        if (pcVar2 == (char *)0x0) break;
        *pcVar2 = '\\';
      }
      TArray<FBaseCVar_*,_FBaseCVar_*>::~TArray(&cvars);
    }
    else {
      while( true ) {
        __s_00 = pBVar4 + 1;
        pcVar2 = strchr((char *)__s_00,0x5c);
        if (pcVar2 == (char *)0x0) break;
        *pcVar2 = '\0';
        __s = pcVar2 + 1;
        pBVar4 = (BYTE *)strchr(__s,0x5c);
        if (pBVar4 == (BYTE *)0x0) {
          cvar_set((char *)__s_00,__s);
          *pcVar2 = '\\';
          break;
        }
        *pBVar4 = '\0';
        cvar_set((char *)__s_00,__s);
        *pcVar2 = '\\';
        *pBVar4 = '\\';
      }
    }
    pBVar4 = *demo_p;
    sVar5 = strlen((char *)pBVar4);
    *demo_p = pBVar4 + sVar5 + 1;
  }
  return;
}

Assistant:

void C_ReadCVars (BYTE **demo_p)
{
	char *ptr = *((char **)demo_p);
	char *breakpt;

	if (*ptr++ != '\\')
		return;

	if (*ptr == '\\')
	{       // compact mode
		TArray<FBaseCVar *> cvars;
		FBaseCVar *cvar;
		DWORD filter;

		ptr++;
		breakpt = strchr (ptr, '\\');
		*breakpt = 0;
		filter = strtoul (ptr, NULL, 16);
		*breakpt = '\\';
		ptr = breakpt + 1;

		FilterCompactCVars (cvars, filter);

		while (cvars.Pop (cvar))
		{
			UCVarValue val;
			breakpt = strchr (ptr, '\\');
			if (breakpt)
				*breakpt = 0;
			val.String = ptr;
			cvar->ForceSet (val, CVAR_String);
			if (breakpt)
			{
				*breakpt = '\\';
				ptr = breakpt + 1;
			}
			else
				break;
		}
	}
	else
	{
		char *value;

		while ( (breakpt = strchr (ptr, '\\')) )
		{
			*breakpt = 0;
			value = breakpt + 1;
			if ( (breakpt = strchr (value, '\\')) )
				*breakpt = 0;

			cvar_set (ptr, value);

			*(value - 1) = '\\';
			if (breakpt)
			{
				*breakpt = '\\';
				ptr = breakpt + 1;
			}
			else
			{
				break;
			}
		}
	}
	*demo_p += strlen (*((char **)demo_p)) + 1;
}